

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

bool __thiscall QCborStreamReader::leaveContainer(QCborStreamReader *this)

{
  long lVar1;
  undefined8 uVar2;
  CborError CVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QMessageLogger local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (*(long *)(lVar1 + 0x30) == 0) {
    local_48.context.version = 2;
    local_48.context.function._4_2_ = 0;
    local_48.context.function._6_1_ = '\0';
    local_48.context.function._7_1_ = '\0';
    local_48.context.line = 0;
    local_48.context.file._0_4_ = 0;
    local_48.context.file._4_4_ = 0;
    local_48.context.function._0_4_ = 0;
    local_48.context.category = "default";
    bVar4 = false;
    QMessageLogger::warning
              (&local_48,"QCborStreamReader::leaveContainer: trying to leave top-level element");
  }
  else if (*(char *)(lVar1 + 0x70) == '\0') {
    local_48.context.function._0_4_ = 0xaaaaaaaa;
    local_48.context.function._4_2_ = 0xaaaa;
    local_48.context.function._6_1_ = 0xaa;
    local_48.context.function._7_1_ = 0xaa;
    local_48.context.version = -0x55555556;
    local_48.context.line = -0x55555556;
    local_48.context.file._0_4_ = 0xaaaaaaaa;
    local_48.context.file._4_4_ = 0xaaaaaaaa;
    QList<CborValue>::takeLast((value_type *)&local_48,(QList<CborValue> *)(lVar1 + 0x20));
    uVar2 = *(undefined8 *)(*(long *)(this + 8) + 0x50);
    local_48.context.file._0_4_ = (undefined4)uVar2;
    local_48.context.file._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    if ((*(byte *)(*(long *)(this + 8) + 0x5f) & 0x10) != 0) {
      advance_bytes((CborValue *)&local_48,1);
    }
    CVar3 = preparse_next_value((CborValue *)&local_48);
    lVar1 = *(long *)(this + 8);
    *(ulong *)(lVar1 + 0x48) = CONCAT44(local_48.context.line,local_48.context.version);
    *(ulong *)(lVar1 + 0x50) = CONCAT44(local_48.context.file._4_4_,local_48.context.file._0_4_);
    *(ulong *)(lVar1 + 0x58) =
         CONCAT44(local_48.context.function._4_4_,(uint32_t)local_48.context.function);
    bVar4 = CVar3 == CborNoError;
    if (bVar4) {
      preparse(this);
    }
    else {
      lVar1 = *(long *)(this + 8);
      if (CVar3 != CborErrorUnexpectedEOF) {
        *(undefined1 *)(lVar1 + 0x70) = 1;
      }
      *(CborError *)(lVar1 + 0x60) = CVar3;
    }
  }
  else {
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QCborStreamReader::leaveContainer()
{
    if (d->containerStack.isEmpty()) {
        qWarning("QCborStreamReader::leaveContainer: trying to leave top-level element");
        return false;
    }
    if (d->corrupt)
        return false;

    CborValue container = d->containerStack.pop();
    CborError err = cbor_value_leave_container(&container, &d->currentElement);
    d->currentElement = container;
    if (err) {
        d->handleError(err);
        return false;
    }

    preparse();
    return true;
}